

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_property.cpp
# Opt level: O2

int __thiscall
lsim::StringProperty::clone
          (StringProperty *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  char *in_RAX;
  char *unaff_RBX;
  
  (**(code **)(*(long *)__fn + 0x10))(__fn);
  make_property(unaff_RBX,in_RAX);
  return (int)this;
}

Assistant:

Property::uptr_t StringProperty::clone() const {
    return make_property(key(), m_value.c_str());
}